

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuffer.c
# Opt level: O0

int membuffer_insert(membuffer *m,void *buf,size_t buf_len,size_t index)

{
  int return_code;
  size_t index_local;
  size_t buf_len_local;
  void *buf_local;
  membuffer *m_local;
  
  if (m == (membuffer *)0x0) {
    __assert_fail("m != NULL",".upnp/src/genlib/util/membuffer.c",0xde,
                  "int membuffer_insert(membuffer *, const void *, size_t, size_t)");
  }
  if (m->length < index) {
    m_local._4_4_ = -0x1fa;
  }
  else if ((buf == (void *)0x0) || (buf_len == 0)) {
    m_local._4_4_ = 0;
  }
  else {
    m_local._4_4_ = membuffer_set_size(m,m->length + buf_len);
    if (m_local._4_4_ == 0) {
      memmove(m->buf + buf_len + index,m->buf + index,m->length - index);
      memcpy(m->buf + index,buf,buf_len);
      m->length = buf_len + m->length;
      m->buf[m->length] = '\0';
      m_local._4_4_ = 0;
    }
  }
  return m_local._4_4_;
}

Assistant:

int membuffer_insert(
	membuffer *m, const void *buf, size_t buf_len, size_t index)
{
	int return_code;

	assert(m != NULL);

	if (index > m->length)
		return UPNP_E_OUTOF_BOUNDS;
	if (!buf || !buf_len) {
		return 0;
	}
	/* alloc mem */
	return_code = membuffer_set_size(m, m->length + buf_len);
	if (return_code) {
		return return_code;
	}
	/* insert data */
	/* move data to right of insertion point */
	memmove(m->buf + index + buf_len, m->buf + index, m->length - index);
	memcpy(m->buf + index, buf, buf_len);
	m->length += buf_len;
	/* null-terminate */
	m->buf[m->length] = 0;

	return 0;
}